

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall
Js::EntryPointPolymorphicInlineCacheInfo::SetPolymorphicInlineCache
          (EntryPointPolymorphicInlineCacheInfo *this,FunctionBody *functionBody,uint index,
          PolymorphicInlineCache *polymorphicInlineCache,bool isInlinee,byte polyCacheUtil)

{
  code *pcVar1;
  bool bVar2;
  PolymorphicInlineCacheInfo *pPVar3;
  undefined4 *puVar4;
  char *message;
  char *error;
  uint lineNumber;
  undefined7 in_register_00000081;
  
  if ((int)CONCAT71(in_register_00000081,isInlinee) == 0) {
    SetPolymorphicInlineCache
              (&this->selfInfo,functionBody,index,polymorphicInlineCache,polyCacheUtil);
    if ((this->selfInfo).functionBody.ptr == functionBody) {
      return;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    error = "(functionBody == selfInfo.GetFunctionBody())";
    message = "functionBody == selfInfo.GetFunctionBody()";
    lineNumber = 0x1fcf;
  }
  else {
    pPVar3 = EnsureInlineeInfo(this,((functionBody->super_ParseableFunctionInfo).super_FunctionProxy
                                    .m_scriptContext)->recycler,functionBody);
    SetPolymorphicInlineCache(pPVar3,functionBody,index,polymorphicInlineCache,polyCacheUtil);
    pPVar3 = GetInlineeInfo(this,functionBody);
    if ((pPVar3->functionBody).ptr == functionBody) {
      return;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    error = "(functionBody == GetInlineeInfo(functionBody)->GetFunctionBody())";
    message = "functionBody == GetInlineeInfo(functionBody)->GetFunctionBody()";
    lineNumber = 0x1fd4;
  }
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                              ,lineNumber,error,message);
  if (bVar2) {
    *puVar4 = 0;
    return;
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void EntryPointPolymorphicInlineCacheInfo::SetPolymorphicInlineCache(FunctionBody * functionBody, uint index, PolymorphicInlineCache * polymorphicInlineCache, bool isInlinee, byte polyCacheUtil)
    {
        if (!isInlinee)
        {
            SetPolymorphicInlineCache(&selfInfo, functionBody, index, polymorphicInlineCache, polyCacheUtil);
            Assert(functionBody == selfInfo.GetFunctionBody());
        }
        else
        {
            SetPolymorphicInlineCache(EnsureInlineeInfo(functionBody->GetScriptContext()->GetRecycler(), functionBody), functionBody, index, polymorphicInlineCache, polyCacheUtil);
            Assert(functionBody == GetInlineeInfo(functionBody)->GetFunctionBody());
        }
    }